

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

int Fra_ClausRunSat(Clu_Man_t *p)

{
  uint uVar1;
  lit *begin;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  int iVar4;
  
  begin = (lit *)malloc((long)p->nFrames * 4 + 4);
  iVar4 = 0;
  pAVar2 = Aig_ManCo(p->pAig,0);
  uVar1 = p->nFrames;
  for (uVar3 = 0; (long)uVar3 <= (long)(int)uVar1; uVar3 = uVar3 + 1) {
    begin[uVar3] = ((uint)(uVar1 != uVar3) | p->pCnf->nVars * iVar4) +
                   p->pCnf->pVarNums[pAVar2->Id] * 2;
    iVar4 = iVar4 + 2;
  }
  iVar4 = sat_solver_solve(p->pSatMain,begin,begin + (long)(int)uVar1 + 1,(long)p->nBTLimit,0,0,0);
  free(begin);
  if (iVar4 == -1) {
    iVar4 = 1;
  }
  else {
    if (iVar4 != 1) {
      __assert_fail("RetValue == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                    ,0x8a,"int Fra_ClausRunSat(Clu_Man_t *)");
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Fra_ClausRunSat( Clu_Man_t * p )
{
    Aig_Obj_t * pObj;
    int * pLits;
    int i, RetValue;
    pLits = ABC_ALLOC( int, p->nFrames + 1 );
    // set the output literals
    pObj = Aig_ManCo(p->pAig, 0);
    for ( i = 0; i <= p->nFrames; i++ )
        pLits[i] = i * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObj->Id], i != p->nFrames ); 
    // try to solve the problem
    RetValue = sat_solver_solve( p->pSatMain, pLits, pLits + p->nFrames + 1, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    ABC_FREE( pLits );
    if ( RetValue == l_False )
        return 1;
    // get the counter-example
    assert( RetValue == l_True );
    return 0;
}